

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O0

int ERKStepPrintAllStats(void *arkode_mem,FILE *outfile,SUNOutputFormat fmt)

{
  int in_EDX;
  FILE *in_RSI;
  int retval;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  SUNOutputFormat in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = erkStep_AccessStepMem
                      ((void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       in_stack_ffffffffffffffd0,
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (ARKodeERKStepMem *)0xea494d);
  if ((local_4 == 0) &&
     (local_4 = arkPrintAllStats(in_RSI,(FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                                 in_stack_ffffffffffffffdc), local_4 == 0)) {
    if (in_EDX == 0) {
      fprintf(in_RSI,"RHS fn evals                 = %ld\n",
              *(undefined8 *)(in_stack_ffffffffffffffd0 + 0x28));
    }
    else {
      if (in_EDX != 1) {
        arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        -0x16,"ARKode","ERKStepPrintAllStats","Invalid formatting option.");
        return -0x16;
      }
      fprintf(in_RSI,",RHS fn evals,%ld",*(undefined8 *)(in_stack_ffffffffffffffd0 + 0x28));
      fprintf(in_RSI,"\n");
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ERKStepPrintAllStats(void *arkode_mem, FILE *outfile, SUNOutputFormat fmt)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "ERKStepPrintAllStats",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  retval = arkPrintAllStats(arkode_mem, outfile, fmt);
  if (retval != ARK_SUCCESS) return(retval);

  switch(fmt)
  {
  case SUN_OUTPUTFORMAT_TABLE:
    fprintf(outfile, "RHS fn evals                 = %ld\n", step_mem->nfe);
    break;
  case SUN_OUTPUTFORMAT_CSV:
    fprintf(outfile, ",RHS fn evals,%ld", step_mem->nfe);
    fprintf(outfile, "\n");
    break;
  default:
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "ERKStepPrintAllStats",
                    "Invalid formatting option.");
    return(ARK_ILL_INPUT);
  }

  return(ARK_SUCCESS);
}